

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O3

int h264_residual(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb,
                 int start,int end)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int32_t (*block) [8] [15];
  int (*num) [16];
  int start_00;
  ulong uVar6;
  bool bVar7;
  int (*local_50) [16];
  int32_t (*local_48) [8] [15];
  
  iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,0);
  if (iVar1 != 0) {
    return 1;
  }
  if (slice->chroma_array_type - 1 < 2) {
    lVar4 = 0;
    bVar7 = true;
    do {
      bVar5 = bVar7;
      iVar1 = h264_residual_block(str,cabac,slice,mb,mb->block_chroma_dc[lVar4],(int *)0x0,3,
                                  (int)lVar4,0,slice->chroma_array_type * 4 + -1,
                                  slice->chroma_array_type << 2,
                                  (uint)((mb->coded_block_pattern & 0x30) != 0 && start == 0));
      if (iVar1 != 0) {
        return 1;
      }
      lVar4 = 1;
      iVar1 = 0;
      bVar7 = false;
    } while (bVar5);
    local_48 = mb->block_chroma_ac;
    start_00 = start + -1;
    if (start == 0) {
      start_00 = iVar1;
    }
    uVar2 = slice->chroma_array_type;
    local_50 = mb->total_coeff;
    lVar4 = 0;
    do {
      local_50 = local_50 + 1;
      if ((uVar2 & 0x3fffffff) != 0) {
        uVar6 = 0;
        block = local_48;
        num = local_50;
        do {
          iVar3 = h264_residual_block(str,cabac,slice,mb,(int32_t *)block,*num,4,iVar1 + (int)uVar6,
                                      start_00,end + -1,0xf,mb->coded_block_pattern & 0x20);
          if (iVar3 != 0) {
            return 1;
          }
          uVar6 = uVar6 + 1;
          uVar2 = slice->chroma_array_type;
          block = (int32_t (*) [8] [15])(*block + 1);
          num = (int (*) [16])(*num + 1);
        } while (uVar6 < uVar2 * 4);
      }
      iVar1 = iVar1 + 8;
      local_48 = local_48 + 1;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
  }
  else if (slice->chroma_array_type == 3) {
    iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = h264_residual_luma(str,cabac,slice,mb,start,end,2);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_residual(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end) {
	if (h264_residual_luma(str, cabac, slice, mb, start, end, 0)) return 1;
	if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
		int i, j;
		for (i = 0; i < 2; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_dc[i], 0, H264_CTXBLOCKCAT_CHROMA_DC, i, 0, 4 * slice->chroma_array_type - 1, 4 * slice->chroma_array_type, (mb->coded_block_pattern & 0x30) && start == 0)) return 1;
		}
		for (i = 0; i < 2; i++) {
			for (j = 0; j < 4 * slice->chroma_array_type; j++) {
				if (h264_residual_block(str, cabac, slice, mb, mb->block_chroma_ac[i][j], &mb->total_coeff[i+1][j], H264_CTXBLOCKCAT_CHROMA_AC, i * 8 + j, (start?start-1:0), end-1, 15, mb->coded_block_pattern & 0x20)) return 1;
			}
		}
	} else if (slice->chroma_array_type == 3) {
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 1)) return 1;
		if (h264_residual_luma(str, cabac, slice, mb, start, end, 2)) return 1;
	}
	return 0;
}